

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O3

void __thiscall
check_arythmetic_operations_for_heat_maps::test_method
          (check_arythmetic_operations_for_heat_maps *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  difference_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> difference;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_590;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_578;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_560;
  undefined1 local_548;
  undefined8 local_540;
  shared_count sStack_538;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_530;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_498;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_3c0;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_328;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_290;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_1f8;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_160;
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  code *local_a0;
  void *local_90;
  long local_80;
  void *local_78;
  long local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&local_560,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_578,&local_560);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_530,"data/file_with_diagram",&local_578,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_578);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_590,&local_560);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_498,"data/file_with_diagram_1",&local_590,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_590);
  Gudhi::Persistence_representations::operation_on_pair_of_heat_maps<std::plus<double>>
            (&local_328,(Persistence_representations *)&local_530,&local_498);
  Gudhi::Persistence_representations::operation_on_pair_of_heat_maps<std::minus<double>>
            (local_c8,(Persistence_representations *)&local_530,&local_498);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  multiply_by_scalar(&local_160,&local_530,2.0);
  local_3c0.discrete = true;
  local_3c0.erase_below_diagonal = false;
  local_3c0.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3c0.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_3c0.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3c0.kernel._M_invoker = (_Invoker_type)0x0;
  local_3c0.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.min_ = 0.0;
  local_3c0.max_ = 0.0;
  local_3c0.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.number_of_functions_for_vectorization = 1;
  local_3c0.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&local_3c0,"data/heat_map_sum");
  local_1f8.discrete = true;
  local_1f8.erase_below_diagonal = false;
  local_1f8.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1f8.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_1f8.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1f8.kernel._M_invoker = (_Invoker_type)0x0;
  local_1f8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.min_ = 0.0;
  local_1f8.max_ = 0.0;
  local_1f8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.number_of_functions_for_vectorization = 1;
  local_1f8.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&local_1f8,"data/heat_map_difference");
  local_290.discrete = true;
  local_290.erase_below_diagonal = false;
  local_290.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_290.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_290.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_290.kernel._M_invoker = (_Invoker_type)0x0;
  local_290.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290.min_ = 0.0;
  local_290.max_ = 0.0;
  local_290.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290.number_of_functions_for_vectorization = 1;
  local_290.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&local_290,"data/heat_map_multiply_by_scalar");
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0xc0);
  local_548 = Gudhi::Persistence_representations::
              Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
              operator==(&local_328,&local_3c0);
  local_540 = 0;
  sStack_538.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_3f0;
  local_3f0 = "sum == sum_template";
  local_3e8 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00113d30;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_3f8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_538);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_290.heat_map);
  if (local_290.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_290.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_290.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_290.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_290.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_290.kernel,(_Any_data *)&local_290.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1f8.heat_map);
  if (local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1f8.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_1f8.kernel,(_Any_data *)&local_1f8.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_3c0.heat_map);
  if (local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c0.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c0.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3c0.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_3c0.kernel,(_Any_data *)&local_3c0.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_160.heat_map);
  if (local_160.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_160.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_160.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_160.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_160.kernel,(_Any_data *)&local_160.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_90 != (void *)0x0) {
    operator_delete(local_90,local_80 - (long)local_90);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(local_b0,local_b0,3);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_328.heat_map);
  if (local_328.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_328.kernel,(_Any_data *)&local_328.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_498.heat_map);
  if (local_498.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_498.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_498.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_498.kernel,(_Any_data *)&local_498.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_530.heat_map);
  if (local_530.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_530.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_530.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_530.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_530.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_530.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_530.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_530.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_530.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_530.kernel,(_Any_data *)&local_530.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_560);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_arythmetic_operations_for_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  Persistence_heat_maps<constant_scaling_function> q("data/file_with_diagram_1", filter, false, 1000, 0, 1);

  Persistence_heat_maps<constant_scaling_function> sum = p + q;
  Persistence_heat_maps<constant_scaling_function> difference = p - q;
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar = 2 * p;

  // sum.print_to_file( "sum" );
  // difference.print_to_file( "difference" );
  // multiply_by_scalar.print_to_file( "multiply_by_scalar" );

  Persistence_heat_maps<constant_scaling_function> sum_template;
  sum_template.load_from_file("data/heat_map_sum");
  Persistence_heat_maps<constant_scaling_function> difference_template;
  difference_template.load_from_file("data/heat_map_difference");
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar_template;
  multiply_by_scalar_template.load_from_file("data/heat_map_multiply_by_scalar");

  BOOST_CHECK(sum == sum_template);
}